

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int stackinuse(lua_State *L)

{
  StkId local_28;
  StkId lim;
  CallInfo *pCStack_18;
  int res;
  CallInfo *ci;
  lua_State *L_local;
  
  local_28 = (L->top).p;
  for (pCStack_18 = L->ci; pCStack_18 != (CallInfo *)0x0; pCStack_18 = pCStack_18->previous) {
    if (local_28 < (pCStack_18->top).p) {
      local_28 = (pCStack_18->top).p;
    }
  }
  lim._4_4_ = (int)((long)local_28 - (L->stack).offset >> 4) + 1;
  if (lim._4_4_ < 0x14) {
    lim._4_4_ = 0x14;
  }
  return lim._4_4_;
}

Assistant:

static int stackinuse (lua_State *L) {
  CallInfo *ci;
  int res;
  StkId lim = L->top.p;
  for (ci = L->ci; ci != NULL; ci = ci->previous) {
    if (lim < ci->top.p) lim = ci->top.p;
  }
  lua_assert(lim <= L->stack_last.p + EXTRA_STACK);
  res = cast_int(lim - L->stack.p) + 1;  /* part of stack in use */
  if (res < LUA_MINSTACK)
    res = LUA_MINSTACK;  /* ensure a minimum size */
  return res;
}